

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferred
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  int iVar1;
  pointer pvVar2;
  pointer pBVar3;
  pointer puVar4;
  pointer puVar5;
  __type _Var6;
  bool bVar7;
  pointer puVar8;
  pointer pBVar9;
  BlockInfo *b;
  __node_base *p_Var10;
  allocator local_62c;
  allocator local_62b;
  allocator local_62a;
  allocator local_629;
  SscReaderGeneric *local_628;
  string *local_620;
  VariableBase *local_618;
  __node_base *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_608;
  CoreDims local_600 [2];
  CoreDims local_5e0 [2];
  CoreDims local_5c0 [2];
  CoreDims local_5a0 [2];
  DimsArray vStart;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vCount;
  DimsArray vShape;
  
  local_628 = this;
  local_620 = (string *)data;
  if (*(int *)(variable + 0x28) == 0xe) {
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,data);
      return;
    }
    p_Var10 = &(this->m_AllReceivingWriterRanks)._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      pvVar2 = (local_628->m_GlobalWritePattern).
               super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar3 = *(pointer *)
                ((long)&pvVar2[(int)*(size_type *)(p_Var10 + 1)].
                        super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (pBVar9 = pvVar2[(int)*(size_type *)(p_Var10 + 1)].
                    super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start; pBVar9 != pBVar3; pBVar9 = pBVar9 + 1
          ) {
        _Var6 = std::operator==(&pBVar9->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(variable + 8));
        if (_Var6) {
          vStart.super_CoreDims.DimCount = (size_t)vStart.Dimensions;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((string *)&vStart,
                     (pBVar9->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     *(pointer *)
                      ((long)&(pBVar9->value).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl + 8));
          std::__cxx11::string::operator=(local_620,(string *)&vStart);
          std::__cxx11::string::~string((string *)&vStart);
        }
      }
    }
  }
  else {
    helper::DimsArray::DimsArray
              (&vStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
    helper::DimsArray::DimsArray
              (&vCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
    helper::DimsArray::DimsArray
              (&vShape,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
    helper::DimsArray::DimsArray
              (&vMemStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xa0)
              );
    helper::DimsArray::DimsArray
              (&vMemCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0xb8)
              );
    if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
      std::__reverse<unsigned_long*>
                (vStart.super_CoreDims.DimensSpan,
                 vStart.super_CoreDims.DimensSpan + vStart.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vCount.super_CoreDims.DimensSpan,
                 vCount.super_CoreDims.DimensSpan + vCount.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vShape.super_CoreDims.DimensSpan,
                 vShape.super_CoreDims.DimensSpan + vShape.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vMemStart.super_CoreDims.DimensSpan,
                 vMemStart.super_CoreDims.DimensSpan + vMemStart.super_CoreDims.DimCount);
      std::__reverse<unsigned_long*>
                (vMemCount.super_CoreDims.DimensSpan,
                 vMemCount.super_CoreDims.DimensSpan + vMemCount.super_CoreDims.DimCount);
    }
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,local_620);
    }
    else {
      local_610 = &(this->m_AllReceivingWriterRanks)._M_h._M_before_begin;
      local_608 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (variable + 8);
      local_618 = variable;
      while (local_610 = local_610->_M_nxt, local_610 != (__node_base *)0x0) {
        pvVar2 = (local_628->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar3 = *(pointer *)
                  ((long)&pvVar2[(int)*(size_type *)(local_610 + 1)].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar9 = pvVar2[(int)*(size_type *)(local_610 + 1)].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pBVar9 != pBVar3;
            pBVar9 = pBVar9 + 1) {
          _Var6 = std::operator==(&pBVar9->name,local_608);
          if (_Var6) {
            puVar5 = *(pointer *)
                      ((long)&(pBVar9->count).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8);
            bVar7 = false;
            puVar4 = *(pointer *)
                      &(pBVar9->count).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            for (puVar8 = puVar4; puVar8 != puVar5; puVar8 = puVar8 + 1) {
              bVar7 = (bool)(bVar7 | *puVar8 == 0);
            }
            if (!bVar7) {
              switch(pBVar9->shapeId) {
              case GlobalValue:
              case LocalValue:
                memcpy(local_620,
                       (local_628->super_SscReaderBase).m_Buffer.m_Buffer + pBVar9->bufferStart,
                       pBVar9->bufferCount);
                break;
              case GlobalArray:
              case LocalArray:
                local_600[0].DimensSpan =
                     *(size_t **)
                      &(pBVar9->start).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
                local_600[0].DimCount =
                     (long)*(pointer *)
                            ((long)&(pBVar9->start).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl + 8) - (long)local_600[0].DimensSpan >> 3;
                local_5c0[0].DimCount = (long)puVar5 - (long)puVar4 >> 3;
                local_5e0[0].DimCount = local_600[0].DimCount;
                local_5e0[0].DimensSpan = local_600[0].DimensSpan;
                local_5c0[0].DimensSpan = puVar4;
                local_5a0[0].DimCount = local_5c0[0].DimCount;
                local_5a0[0].DimensSpan = puVar4;
                adios2::helper::NdCopy
                          ((char *)((local_628->super_SscReaderBase).m_Buffer.m_Buffer +
                                   pBVar9->bufferStart),local_5e0,local_5a0,true,true,
                           (char *)local_620,&vStart.super_CoreDims,&vCount.super_CoreDims,true,true
                           ,*(int *)(variable + 0x30),local_600,local_5c0,&vMemStart.super_CoreDims,
                           &vMemCount.super_CoreDims,false,Host,false);
                break;
              default:
                std::__cxx11::string::string((string *)local_5e0,"Engine",&local_629);
                std::__cxx11::string::string((string *)local_5a0,"SscReaderGeneric",&local_62a);
                std::__cxx11::string::string((string *)local_600,"GetDeferredCommon",&local_62b);
                std::__cxx11::string::string((string *)local_5c0,"unknown ShapeID",&local_62c);
                iVar1 = (local_628->super_SscReaderBase).m_ReaderRank;
                adios2::helper::Log((string *)local_5e0,(string *)local_5a0,(string *)local_600,
                                    (string *)local_5c0,iVar1,iVar1,0,
                                    (local_628->super_SscReaderBase).m_Verbosity,FATALERROR);
                std::__cxx11::string::~string((string *)local_5c0);
                std::__cxx11::string::~string((string *)local_600);
                std::__cxx11::string::~string((string *)local_5a0);
                std::__cxx11::string::~string((string *)local_5e0);
                variable = local_618;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SscReaderGeneric::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *dataString = reinterpret_cast<std::string *>(data);
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            GetDeferredDeltaCommon(variable, data);
        }
        else
        {
            for (const auto &i : m_AllReceivingWriterRanks)
            {
                const auto &v = m_GlobalWritePattern[i.first];
                for (const auto &b : v)
                {
                    if (b.name == variable.m_Name)
                    {
                        *dataString = std::string(b.value.begin(), b.value.end());
                    }
                }
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vShape(variable.m_Shape);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        GetDeferredDeltaCommon(variable, data);
    }
    else
    {

        for (const auto &i : m_AllReceivingWriterRanks)
        {
            const auto &v = m_GlobalWritePattern[i.first];
            for (const auto &b : v)
            {
                if (b.name == variable.m_Name)
                {
                    bool empty = false;
                    for (const auto c : b.count)
                    {
                        if (c == 0)
                        {
                            empty = true;
                        }
                    }
                    if (empty)
                    {
                        continue;
                    }

                    if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
                    {
                        helper::NdCopy(m_Buffer.data<char>() + b.bufferStart,
                                       helper::CoreDims(b.start), helper::CoreDims(b.count), true,
                                       true, reinterpret_cast<char *>(data), vStart, vCount, true,
                                       true, static_cast<int>(variable.m_ElementSize),
                                       helper::CoreDims(b.start), helper::CoreDims(b.count),
                                       vMemStart, vMemCount);
                    }
                    else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                    {
                        std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
                    }
                    else
                    {
                        helper::Log("Engine", "SscReaderGeneric", "GetDeferredCommon",
                                    "unknown ShapeID", m_ReaderRank, m_ReaderRank, 0, m_Verbosity,
                                    helper::LogMode::FATALERROR);
                    }
                }
            }
        }
    }
}